

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O2

void embree::displacementFunction(RTCDisplacementFunctionNArguments *args)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  uint i;
  ulong uVar11;
  float fVar12;
  Vec3fa P;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  pfVar5 = args->Ng_x;
  pfVar6 = args->Ng_y;
  pfVar7 = args->Ng_z;
  pfVar8 = args->P_x;
  pfVar9 = args->P_y;
  pfVar10 = args->P_z;
  uVar4 = args->N;
  for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
    local_48.m128[1] = pfVar9[uVar11];
    local_48.m128[0] = pfVar8[uVar11];
    local_48.m128[2] = pfVar10[uVar11];
    local_48.m128[3] = 0.0;
    fVar1 = pfVar6[uVar11];
    fVar2 = pfVar5[uVar11];
    fVar3 = pfVar7[uVar11];
    fVar12 = displacement((Vec3fa *)&local_48.field_1);
    pfVar8[uVar11] = pfVar8[uVar11] + fVar12 * fVar2;
    pfVar9[uVar11] = fVar12 * fVar1 + pfVar9[uVar11];
    pfVar10[uVar11] = fVar12 * fVar3 + pfVar10[uVar11];
  }
  return;
}

Assistant:

void displacementFunction(const struct RTCDisplacementFunctionNArguments* args)
{
  const float* nx = args->Ng_x;
  const float* ny = args->Ng_y;
  const float* nz = args->Ng_z;
  float* px = args->P_x;
  float* py = args->P_y;
  float* pz = args->P_z;
  unsigned int N = args->N;
                                   
  for (unsigned int i=0; i<N; i++) {
    const Vec3fa P = Vec3fa(px[i],py[i],pz[i]);
    const Vec3fa Ng = Vec3fa(nx[i],ny[i],nz[i]);
    const Vec3fa dP = displacement(P)*Ng;
    px[i] += dP.x; py[i] += dP.y; pz[i] += dP.z;
  }
}